

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

double Minisat::memUsedPeak(bool strictlyPeak)

{
  int iVar1;
  double local_20;
  double peak;
  bool strictlyPeak_local;
  
  iVar1 = memReadPeak();
  local_20 = (double)iVar1 / 1024.0;
  if (((local_20 == 0.0) && (!NAN(local_20))) && (!strictlyPeak)) {
    local_20 = memUsed();
  }
  return local_20;
}

Assistant:

double Minisat::memUsedPeak(bool strictlyPeak) { 
    double peak = memReadPeak() / (double)1024;
    return peak == 0 && !strictlyPeak ? memUsed() : peak; }